

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O0

void test_bin_ext(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  int nstr;
  uint uVar1;
  FitsKey **ppFVar2;
  FitsKey *pFVar3;
  int iVar4;
  ushort **ppuVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  double dVar11;
  char *pcStack_d0;
  int nexlkeys;
  char *exlkeys [1];
  int datatype;
  int vla;
  int mcol;
  int numusrkey;
  FitsKey **kwds;
  int width;
  int repeat;
  long tdim [10];
  int ntdim;
  char *p;
  long lStack_40;
  int status;
  long l;
  int n;
  int k;
  int j;
  int i;
  FitsKey *pkey;
  FitsHdu *hduptr_local;
  FILE *out_local;
  fitsfile *infits_local;
  
  p._4_4_ = 0;
  pcStack_d0 = "TBCOL";
  ppFVar2 = hduptr->kwds;
  nstr = hduptr->tkeys;
  uVar1 = hduptr->ncols;
  pkey = (FitsKey *)hduptr;
  hduptr_local = (FitsHdu *)out;
  out_local = (FILE *)infits;
  test_ext(infits,out,hduptr);
  test_tbl((fitsfile *)out_local,(FILE *)hduptr_local,(FitsHdu *)pkey);
  strcpy(temp,"TNULL");
  ptemp = temp;
  key_match(tmpkwds,nstr,&ptemp,0,(int *)((long)&l + 4),(int *)&l);
  for (n = l._4_4_; n < l._4_4_ + (int)l; n = n + 1) {
    pFVar3 = ppFVar2[n];
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)pFVar3->kname[5]] & 0x800) != 0) {
      check_int(ppFVar2[n],(FILE *)hduptr_local);
      uVar6 = strtol(pFVar3->kname + 5,(char **)0x0,10);
      k = (int)uVar6 + -1;
      if ((k < 0) || ((int)uVar1 <= k)) {
        sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                (ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n],uVar6 & 0xffffffff,(ulong)uVar1);
        wrterr((FILE *)hduptr_local,errmes,1);
      }
      else {
        pcVar7 = strchr(tform[k],0x42);
        if ((((pcVar7 == (char *)0x0) && (pcVar7 = strchr(tform[k],0x49), pcVar7 == (char *)0x0)) &&
            (pcVar7 = strchr(tform[k],0x4a), pcVar7 == (char *)0x0)) &&
           (pcVar7 = strchr(tform[k],0x4b), pcVar7 == (char *)0x0)) {
          sprintf(errmes,"Keyword #%d, %s is used for the column with format \"%s \".",
                  (ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n],tform[k]);
          wrterr((FILE *)hduptr_local,errmes,2);
        }
        lStack_40 = strtol(ppFVar2[n]->kvalue,(char **)0x0,10);
        pcVar7 = strchr(tform[k],0x42);
        if ((pcVar7 != (char *)0x0) && ((lStack_40 < 0 || (0xff < lStack_40)))) {
          sprintf(errmes,"Keyword #%d, %s: The value %ld",(ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n]
                  ,lStack_40);
          strcat(errmes," is not in the range of datatype B.");
          wrtwrn((FILE *)hduptr_local,errmes,0);
        }
        lStack_40 = strtol(ppFVar2[n]->kvalue,(char **)0x0,10);
        pcVar7 = strchr(tform[k],0x49);
        if ((pcVar7 != (char *)0x0) && ((lStack_40 < -0x8000 || (0x7fff < lStack_40)))) {
          sprintf(errmes,"Keyword #%d, %s: The value %ld",(ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n]
                  ,lStack_40);
          strcat(errmes," is not in the range of datatype I ");
          wrtwrn((FILE *)hduptr_local,errmes,0);
        }
      }
    }
  }
  strcpy(temp,"TSCAL");
  ptemp = temp;
  key_match(tmpkwds,nstr,&ptemp,0,(int *)((long)&l + 4),(int *)&l);
  for (n = l._4_4_; n < l._4_4_ + (int)l; n = n + 1) {
    pFVar3 = ppFVar2[n];
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)pFVar3->kname[5]] & 0x800) != 0) {
      iVar4 = check_flt(ppFVar2[n],(FILE *)hduptr_local);
      if (iVar4 != 0) {
        dVar11 = strtod(ppFVar2[n]->kvalue,(char **)0x0);
        if ((dVar11 == 0.0) && (!NAN(dVar11))) {
          sprintf(errmes,"Keyword #%d, %s:",(ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n]);
          strcat(errmes,"The scaling factor is zero.");
          wrtwrn((FILE *)hduptr_local,errmes,0);
        }
      }
      uVar6 = strtol(pFVar3->kname + 5,(char **)0x0,10);
      k = (int)uVar6 + -1;
      if ((k < 0) || ((int)uVar1 <= k)) {
        sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                (ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n],uVar6 & 0xffffffff,(ulong)uVar1);
        wrterr((FILE *)hduptr_local,errmes,1);
      }
      else {
        pcVar7 = strchr(tform[k],0x41);
        if (((pcVar7 != (char *)0x0) || (pcVar7 = strchr(tform[k],0x4c), pcVar7 != (char *)0x0)) ||
           (pcVar7 = strchr(tform[k],0x58), pcVar7 != (char *)0x0)) {
          sprintf(errmes,"Keyword #%d, %s is used in A, L, or X column. ",
                  (ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n]);
          wrterr((FILE *)hduptr_local,errmes,1);
        }
      }
    }
  }
  strcpy(temp,"TZERO");
  ptemp = temp;
  key_match(tmpkwds,nstr,&ptemp,0,(int *)((long)&l + 4),(int *)&l);
  for (n = l._4_4_; n < l._4_4_ + (int)l; n = n + 1) {
    pFVar3 = ppFVar2[n];
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)pFVar3->kname[5]] & 0x800) != 0) {
      check_flt(ppFVar2[n],(FILE *)hduptr_local);
      uVar6 = strtol(pFVar3->kname + 5,(char **)0x0,10);
      k = (int)uVar6 + -1;
      if ((k < 0) || ((int)uVar1 <= k)) {
        sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                (ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n],uVar6 & 0xffffffff,(ulong)uVar1);
        wrterr((FILE *)hduptr_local,errmes,1);
      }
      else {
        pcVar7 = strchr(tform[k],0x41);
        if (((pcVar7 != (char *)0x0) && (pcVar7 = strchr(tform[k],0x4c), pcVar7 != (char *)0x0)) &&
           (pcVar7 = strchr(tform[k],0x58), pcVar7 != (char *)0x0)) {
          sprintf(errmes,"Keyword #%d, %s is used in A, L, or X column. ",
                  (ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n]);
          wrterr((FILE *)hduptr_local,errmes,1);
        }
      }
    }
  }
  *(int *)pkey[1].kname =
       (int)**(undefined8 **)(pkey->kname + 0x28) *
       (int)*(undefined8 *)(*(long *)(pkey->kname + 0x28) + 8);
  strcpy(temp,"THEAP");
  key_match(tmpkwds,nstr,&ptemp,1,(int *)((long)&l + 4),(int *)&l);
  if (-1 < l._4_4_) {
    iVar4 = check_int(ppFVar2[l._4_4_],(FILE *)hduptr_local);
    if (iVar4 != 0) {
      lVar8 = strtol((char *)(*(long *)(*(long *)(pkey[1].kname + 8) + (long)l._4_4_ * 8) + 0x50),
                     (char **)0x0,10);
      *(int *)pkey[1].kname = (int)lVar8;
    }
    if (*(long *)(pkey->kname + 0x18) == 0) {
      sprintf(errmes,"Pcount is zero, but keyword THEAP is present at record #%d). ",
              (ulong)(uint)ppFVar2[l._4_4_]->kindex);
      wrterr((FILE *)hduptr_local,errmes,1);
    }
  }
  exlkeys[0]._4_4_ = 0;
  if (*(long *)(pkey->kname + 0x18) != 0) {
    for (k = 0; k < (int)uVar1; k = k + 1) {
      iVar4 = ffgtcl(out_local,k + 1,exlkeys,0,0,(long)&p + 4);
      if (iVar4 != 0) {
        sprintf(errmes,"Column #%d: ",(ulong)(uint)k);
        wrtferr((FILE *)hduptr_local,errmes,(int *)((long)&p + 4),2);
      }
      if ((int)exlkeys[0] < 0) {
        exlkeys[0]._4_4_ = 1;
        break;
      }
    }
    if (exlkeys[0]._4_4_ == 0) {
      sprintf(errmes,"PCOUNT = %ld, but there are no variable-length array columns.",
              *(undefined8 *)(pkey->kname + 0x18));
      wrtwrn((FILE *)hduptr_local,errmes,0);
    }
  }
  strcpy(temp,"TDIM");
  key_match(tmpkwds,nstr,&ptemp,0,(int *)((long)&l + 4),(int *)&l);
  for (n = l._4_4_; n < l._4_4_ + (int)l; n = n + 1) {
    _j = ppFVar2[n];
    pcVar7 = _j->kname;
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)pcVar7[4]] & 0x800) != 0) {
      check_str(ppFVar2[n],(FILE *)hduptr_local);
      if (_j->kvalue[0] == ' ') {
        sprintf(errmes,"Keyword #%d, %s: TDIM=\"%s\" ",(ulong)(uint)_j->kindex,_j,_j->kvalue);
        strcat(errmes,"should not have leading space.");
        wrterr((FILE *)hduptr_local,errmes,1);
      }
      else {
        uVar6 = strtol(pcVar7 + 4,(char **)0x0,10);
        k = (int)uVar6 + -1;
        if ((k < 0) || ((int)uVar1 <= k)) {
          sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                  (ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n],uVar6 & 0xffffffff,(ulong)uVar1);
          wrterr((FILE *)hduptr_local,errmes,1);
        }
        else {
          iVar4 = ffdtdm(out_local,_j->kvalue,(int)uVar6,10,(long)tdim + 0x4c,&width,(long)&p + 4);
          if (iVar4 != 0) {
            sprintf(errmes,"Keyword #%d, %s: ",(ulong)(uint)ppFVar2[n]->kindex,ppFVar2[n]);
            wrtferr((FILE *)hduptr_local,errmes,(int *)((long)&p + 4),1);
          }
        }
      }
    }
  }
  for (k = 0; k < *(int *)(pkey->kname + 0x30); k = k + 1) {
    pcVar7 = strchr(tform[k],0x41);
    if (pcVar7 != (char *)0x0) {
      uVar6 = strtol(tform[k],(char **)0x0,10);
      ppuVar5 = __ctype_b_loc();
      if ((((*ppuVar5)[(int)pcVar7[1]] & 0x800) != 0) &&
         (uVar9 = strtol(pcVar7 + 1,(char **)0x0,10), (int)uVar6 % (int)uVar9 != 0)) {
        sprintf(errmes,"TFORM %s of column %d: repeat %d is not the multiple of the width %d",
                tform[k],(ulong)(k + 1),uVar6 & 0xffffffff,uVar9 & 0xffffffff);
        wrtwrn((FILE *)hduptr_local,errmes,0);
      }
    }
  }
  for (k = 0; k < 1; k = k + 1) {
    strcpy(temp,*(char **)((long)&stack0xffffffffffffff30 + (long)k * 8));
    ptemp = temp;
    key_match(tmpkwds,nstr,&ptemp,0,(int *)((long)&l + 4),(int *)&l);
    if (-1 < l._4_4_) {
      for (n = l._4_4_; n < l._4_4_ + (int)l; n = n + 1) {
        _j = *(FitsKey **)(*(long *)(pkey[1].kname + 8) + (long)n * 8);
        pFVar3 = ppFVar2[n];
        sVar10 = strlen(temp);
        ppuVar5 = __ctype_b_loc();
        if (((*ppuVar5)[(int)pFVar3->kname[sVar10]] & 0x800) != 0) {
          sprintf(errmes,"Keyword #%d, %s is not allowed in the Binary table.",
                  (ulong)(uint)_j->kindex,_j);
          wrterr((FILE *)hduptr_local,errmes,1);
        }
      }
    }
  }
  test_colnam((FILE *)hduptr_local,(FitsHdu *)pkey);
  return;
}

Assistant:

void test_bin_ext(fitsfile *infits, 	/* input fits file   */ 
	     FILE*     out,	/* output ascii file */
	     FitsHdu  *hduptr	/* information about header */
            )
{
    FitsKey *pkey;
    int i,j,k,n;
    long l;
    int status = 0;
    char *p;

    int ntdim;
    long tdim[10];
    int repeat, width;
    FitsKey **kwds;
    int numusrkey;
    int mcol, vla, datatype;

    /* The indexed keywords excluded from ascii table */
    char *exlkeys[] = { "TBCOL"}; 
    int nexlkeys = 1;

    kwds = hduptr->kwds;
    numusrkey = hduptr->tkeys;
    mcol = hduptr->ncols;

    /* General extension */ 
    test_ext(infits,out,hduptr);

    /* General table */ 
    test_tbl(infits,out,hduptr);

    /* The XTENSION, BITPIX, NAXIS, NAXISn, TFIELDS, PCOUNT, GCOUNT, TFORMn,  
       TTYPEn keywords  have been checked in CFITSIO */
    
    /*  Check TNULLn keywords */ 
    strcpy(temp,"TNULL");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	check_int(kwds[j],out);
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
           kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'B') == NULL &&  
           strchr(tform[i],'I') == NULL &&  
           strchr(tform[i],'J') == NULL &&  
           strchr(tform[i],'K') == NULL ) { 
            sprintf(errmes,
     "Keyword #%d, %s is used for the column with format \"%s \".", 
            kwds[j]->kindex,kwds[j]->kname,tform[i]); 
            wrterr(out,errmes,2); 
        } 
        l = strtol(kwds[j]->kvalue,NULL,10); 
        if(strchr(tform[i],'B') != NULL && (
            l < 0 || l > 255) ) {
            sprintf(errmes,"Keyword #%d, %s: The value %ld", 
            kwds[j]->kindex,kwds[j]->kname, l); 
            strcat(errmes, " is not in the range of datatype B.");
            wrtwrn(out,errmes,0); 
        }
        l = strtol(kwds[j]->kvalue,NULL,10); 
        if(strchr(tform[i],'I') != NULL && (
            l < -32768 || l > 32767) ) {
            sprintf(errmes,"Keyword #%d, %s: The value %ld", 
            kwds[j]->kindex,kwds[j]->kname, l); 
            strcat(errmes, " is not in the range of datatype I ");
            wrtwrn(out,errmes,0); 
        }
    } 
    
    /*  Check TSCALn keywords */ 
    strcpy(temp,"TSCAL");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	if (check_flt(kwds[j],out) && strtod(kwds[j]->kvalue,NULL) == 0.0) { 
            sprintf(errmes,"Keyword #%d, %s:",
            kwds[j]->kindex,kwds[j]->kname);
            strcat(errmes,
              "The scaling factor is zero.");
            wrtwrn(out,errmes,0); 
        }
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'A') != NULL ||  
           strchr(tform[i],'L') != NULL ||  
           strchr(tform[i],'X') != NULL ) { 
            sprintf(errmes,
         "Keyword #%d, %s is used in A, L, or X column. ",
            kwds[j]->kindex,kwds[j]->kname); 
            wrterr(out,errmes,1); 
        }
    } 

    /*  Check TZEROn keywords */ 
    strcpy(temp,"TZERO");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	check_flt(kwds[j],out);
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'A') != NULL &&  
           strchr(tform[i],'L') != NULL &&  
           strchr(tform[i],'X') != NULL ) { 
            sprintf(errmes,
                "Keyword #%d, %s is used in A, L, or X column. ",
            kwds[j]->kindex,kwds[j]->kname); 
            wrterr(out,errmes,1); 
        }
    } 

    /* Check THEAP keyword */   
    hduptr->heap = (hduptr->naxes[0]) * (hduptr->naxes[1]);
    strcpy(temp,"THEAP");
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n);  
    if(k > -1) { 
         if(check_int(kwds[k],out))
             hduptr->heap = (int) strtol(hduptr->kwds[k]->kvalue,NULL,10);
         if(!hduptr->pcount) { 
            sprintf( errmes, 
               "Pcount is zero, but keyword THEAP is present at record #%d). ",
	        kwds[k]->kindex);
                wrterr(out,errmes,1); 
         }
    }

    /* if PCOUNT != 0, test that there is at least 1 variable length array column */
    vla = 0;
    if(hduptr->pcount) {
        for (i=0; i< mcol; i++){ 
            if(fits_get_coltype(infits, i+1, &datatype, NULL, NULL, &status)){ 
               sprintf(errmes,"Column #%d: ",i);
 	       wrtferr(out,errmes, &status,2);
            }
            if (datatype < 0) {
	      vla = 1;
	      break;
	    }
	}

	if (vla == 0) {
	    sprintf(errmes,
	    "PCOUNT = %ld, but there are no variable-length array columns.",
	   (long) hduptr->pcount);
            wrtwrn(out,errmes,0);
	} 
    }
      
   
    /* Check TDIMn  keywords */ 
    strcpy(temp,"TDIM");
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
        pkey = kwds[j]; 
	p = pkey->kname; 
	p += 4;
        if(!isdigit((int)*p)) continue;
	check_str(kwds[j],out);
        if(*(pkey->kvalue) == ' ') { 
            sprintf(errmes,"Keyword #%d, %s: TDIM=\"%s\" ", 
                pkey->kindex,pkey->kname,pkey->kvalue); 
            strcat(errmes,
                    "should not have leading space.");
            wrterr(out,errmes,1); 
            continue;
        }
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
	if(fits_decode_tdim(infits,pkey->kvalue,i+1,10,&ntdim,tdim, &status)){ 
           sprintf(errmes,"Keyword #%d, %s: ", 
                kwds[j]->kindex,kwds[j]->kname);
	    wrtferr(out,errmes,&status,1);
        } 
    } 

    /* check the local convension "rAw"*/
    for (i = 0; i < hduptr->ncols; i++) { 
	if((p = strchr(tform[i],'A'))==NULL) continue; 
        repeat = (int) strtol(tform[i],NULL,10);
        p++;
	if(!isdigit((int)*p))continue;
	width = (int)strtol(p,NULL,10);
	if(repeat%width != 0)  { 
	    sprintf(errmes,
	 "TFORM %s of column %d: repeat %d is not the multiple of the width %d",
	    tform[i], i+1, repeat, width);
            wrtwrn(out,errmes,0);
        } 
    }
   
    for (i = 0; i < nexlkeys; i++) {
        strcpy(temp,exlkeys[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
        if(k < 0) continue;
        for (j = k; j < k+n; j++) { 
            pkey = hduptr->kwds[j];

	    p = kwds[j]->kname; 
	    p += strlen(temp);
            if(!isdigit((int)*p)) continue;

            sprintf( errmes, 
               "Keyword #%d, %s is not allowed in the Binary table.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
        } 
    }
    
    /* check whether the column name is unique */
    test_colnam(out, hduptr);
    return ;
}